

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O0

void __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::directed_flag_complex_in_memory_t
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this,directed_graph_t *graph,
          size_t nb_threads,int max_dimension)

{
  ostream *__args_2;
  ostream *this_00;
  ostream *this_01;
  size_t in_RDX;
  directed_graph_t *in_RSI;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *in_RDI;
  unsigned_long i;
  unsigned_long index_1;
  vector<std::thread,_std::allocator<std::thread>_> t;
  vertex_index_t index;
  value_type *in_stack_ffffffffffffff18;
  thread *__t;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *in_stack_ffffffffffffff20;
  allocator_type *__a;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *in_stack_ffffffffffffff38;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *pdVar1;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *__args_3;
  unsigned_long *in_stack_ffffffffffffff68;
  ulong __n;
  directed_graph_t *in_stack_ffffffffffffff70;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *in_stack_ffffffffffffff78;
  code *in_stack_ffffffffffffff80;
  int *__args_4;
  allocator_type local_61;
  vector<std::thread,_std::allocator<std::thread>_> local_60 [2];
  ushort local_2e;
  undefined1 local_1c [12];
  directed_graph_t *local_10;
  
  __args_3 = in_RDI;
  local_1c._4_8_ = in_RDX;
  local_10 = in_RSI;
  std::
  vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ::vector((vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
            *)0x1cfec0);
  __args_3->nb_threads = local_1c._4_8_;
  __args_2 = std::operator<<((ostream *)&std::cout,"\x1b[K");
  this_00 = std::operator<<(__args_2,"constructing the directed flag complex");
  this_01 = (ostream *)std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
  std::operator<<(this_01,"\r");
  std::
  vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ::reserve(&in_RDI->vertex_cells,(size_type)this_00);
  for (local_2e = 0; local_2e < local_10->number_of_vertices; local_2e = local_2e + 1) {
    pdVar1 = in_RDI;
    directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::
    directed_flag_complex_cell_in_memory_t
              (in_stack_ffffffffffffff20,(vertex_index_t)((ulong)in_stack_ffffffffffffff18 >> 0x30))
    ;
    std::
    vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
    ::push_back((vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                 *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff38 = in_RDI;
    in_RDI = pdVar1;
  }
  __a = &local_61;
  std::allocator<std::thread>::allocator((allocator<std::thread> *)0x1cfff0);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)this_01,
             (size_type)in_stack_ffffffffffffff38,__a);
  std::allocator<std::thread>::~allocator((allocator<std::thread> *)0x1d0016);
  for (__args_4 = (int *)0x0; __args_4 < (int *)(local_1c._4_8_ - 1);
      __args_4 = (int *)((long)__args_4 + 1)) {
    in_stack_ffffffffffffff80 = construction_worker_thread<std::pair<int,float>>;
    __t = (thread *)local_1c;
    in_stack_ffffffffffffff70 = local_10;
    in_stack_ffffffffffffff78 = in_RDI;
    std::thread::
    thread<void(*)(int,int,directed_flag_complex_in_memory_t<std::pair<int,float>>*,directed_graph_t_const*,int),unsigned_long_const&,unsigned_long&,directed_flag_complex_in_memory_t<std::pair<int,float>>*,directed_graph_t_const*,int&,void>
              ((thread *)construction_worker_thread<std::pair<int,float>>,
               (_func_void_int_int_directed_flag_complex_in_memory_t<std::pair<int,_float>_>_ptr_directed_graph_t_ptr_int
                **)in_RDI,(unsigned_long *)local_10,in_stack_ffffffffffffff68,
               (directed_flag_complex_in_memory_t<std::pair<int,_float>_> **)__args_2,
               (directed_graph_t **)__args_3,__args_4);
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](local_60,(size_type)__args_4)
    ;
    std::thread::operator=((thread *)in_stack_ffffffffffffff20,__t);
    std::thread::~thread((thread *)0x1d00bb);
  }
  construction_worker_thread<std::pair<int,float>>
            ((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  for (__n = 0; __n < local_1c._4_8_ - 1; __n = __n + 1) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](local_60,__n);
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)__a);
  return;
}

Assistant:

directed_flag_complex_in_memory_t<ExtraData>::directed_flag_complex_in_memory_t(const directed_graph_t& graph,
                                                                                const size_t nb_threads,
                                                                                int max_dimension)
    : nb_threads(nb_threads) {
#ifdef INDICATE_PROGRESS
	std::cout << "\033[K"
	          << "constructing the directed flag complex" << std::flush << "\r";
#endif

	// First we add the vertices of the directed flag complex
	vertex_cells.reserve(graph.number_of_vertices);
	for (vertex_index_t index = 0; index < graph.number_of_vertices; index++)
		vertex_cells.push_back(directed_flag_complex_cell_in_memory_t<ExtraData>(index));

	// Now we start a few threads to construct the flag complex
	std::vector<std::thread> t(nb_threads - 1);

	for (auto index = 0ul; index < nb_threads - 1; ++index)
		t[index] = std::thread(&construction_worker_thread<ExtraData>, nb_threads, index, this, &graph, max_dimension);

	// Also do work in this thread, namely the last bit
	// For this last thread, take all the remaining vertices
	construction_worker_thread(nb_threads, nb_threads - 1, this, &graph, max_dimension);

	// Wait until all threads stopped
	for (auto i = 0ul; i < nb_threads - 1; ++i) t[i].join();
}